

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O2

char * rapidjson::internal::i32toa(int32_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/itoa.h"
                  ,0x74,"char *rapidjson::internal::i32toa(int32_t, char *)");
  }
  if (value < 0) {
    *buffer = '-';
    pcVar5 = u32toa(-value,buffer + 1);
    return pcVar5;
  }
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/arnodeceuninck[P]CLizard/src/indiv/rapidjson/internal/itoa.h"
                  ,0x28,"char *rapidjson::internal::u32toa(uint32_t, char *)");
  }
  if (9999 < (uint)value) {
    if (99999999 < (uint)value) {
      uVar6 = (ulong)(uint)value / 100000000;
      uVar7 = (ulong)(uint)value % 100000000;
      if ((uint)value < 1000000000) {
        *buffer = (byte)uVar6 | 0x30;
        pcVar5 = buffer + 1;
      }
      else {
        *buffer = GetDigitsLut()::cDigitsLut[uVar6 * 2];
        buffer[1] = GetDigitsLut()::cDigitsLut[(ulong)(uint)((int)uVar6 * 2) + 1];
        pcVar5 = buffer + 2;
      }
      uVar4 = (ushort)(uVar7 % 10000);
      *(undefined2 *)pcVar5 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar7 / 1000000) * 2);
      *(undefined2 *)(pcVar5 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar7 / 10000) % 100) * 2);
      *(undefined2 *)(pcVar5 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar4 / 100) * 2);
      *(undefined2 *)(pcVar5 + 6) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar4 % 100) * 2);
      return pcVar5 + 8;
    }
    uVar1 = (uint)(ushort)((ulong)(uint)value % 10000);
    uVar2 = ((uint)value / 1000000) * 2;
    uVar7 = (ulong)(((uint)(ushort)((ulong)(uint)value / 10000) % 100) * 2);
    uVar3 = (uVar1 / 100) * 2;
    uVar6 = (ulong)((uVar1 % 100) * 2);
    if ((uint)value < 10000000) {
      if (999999 < (uint)value) goto LAB_00117dc5;
      if ((uint)value < 100000) goto LAB_00117de7;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[uVar2];
      buffer = buffer + 1;
LAB_00117dc5:
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar7];
    buffer = buffer + 1;
LAB_00117de7:
    *buffer = GetDigitsLut()::cDigitsLut[uVar7 + 1];
    buffer[1] = GetDigitsLut()::cDigitsLut[uVar3];
    buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
    buffer[3] = GetDigitsLut()::cDigitsLut[uVar6];
    buffer[4] = GetDigitsLut()::cDigitsLut[uVar6 + 1];
    return buffer + 5;
  }
  uVar1 = ((value & 0xffffU) / 100) * 2;
  uVar2 = ((value & 0xffffU) % 100) * 2;
  if ((uint)value < 1000) {
    if (99 < (uint)value) goto LAB_00117d44;
    if ((uint)value < 10) goto LAB_00117d66;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar1];
    buffer = buffer + 1;
LAB_00117d44:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar1 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar2];
  buffer = buffer + 1;
LAB_00117d66:
  *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
  return buffer + 1;
}

Assistant:

inline char* i32toa(int32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    uint32_t u = static_cast<uint32_t>(value);
    if (value < 0) {
        *buffer++ = '-';
        u = ~u + 1;
    }

    return u32toa(u, buffer);
}